

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O1

void __thiscall LogFile::LogFile(LogFile *this,string *basename,int flushEveryN)

{
  pointer pcVar1;
  pthread_mutex_t *__mutex;
  AppendFile *this_00;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &(this->basename_).field_2;
  (this->basename_)._M_dataplus._M_p = (pointer)local_38;
  pcVar1 = (basename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + basename->_M_string_length);
  this->flushEveryN_ = flushEveryN;
  this->count_ = 0;
  __mutex = (pthread_mutex_t *)operator_new(0x28);
  pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  (this->mutex_)._M_t.super___uniq_ptr_impl<MutexLock,_std::default_delete<MutexLock>_>._M_t.
  super__Tuple_impl<0UL,_MutexLock_*,_std::default_delete<MutexLock>_>.
  super__Head_base<0UL,_MutexLock_*,_false>._M_head_impl = (MutexLock *)__mutex;
  (this->file_)._M_t.super___uniq_ptr_impl<AppendFile,_std::default_delete<AppendFile>_>._M_t.
  super__Tuple_impl<0UL,_AppendFile_*,_std::default_delete<AppendFile>_>.
  super__Head_base<0UL,_AppendFile_*,_false>._M_head_impl = (AppendFile *)0x0;
  std::__cxx11::string::find((char)this,0x2f);
  this_00 = (AppendFile *)operator_new(0x10010);
  pcVar1 = (basename->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + basename->_M_string_length);
  AppendFile::AppendFile(this_00,&local_58);
  std::__uniq_ptr_impl<AppendFile,_std::default_delete<AppendFile>_>::reset
            ((__uniq_ptr_impl<AppendFile,_std::default_delete<AppendFile>_> *)&this->file_,this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

LogFile::LogFile(const std::string& basename, int flushEveryN)
    : basename_(basename), flushEveryN_(flushEveryN), count_(0), mutex_(new MutexLock) {
    assert(basename_.find('/') >= 0);
    file_.reset(new AppendFile(basename));
}